

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_collapse.c
# Opt level: O3

REF_STATUS ref_collapse_post_uv_area(REF_GRID ref_grid,REF_INT node)

{
  REF_CELL ref_cell;
  REF_ADJ pRVar1;
  REF_NODE ref_node;
  REF_GEOM pRVar2;
  REF_ADJ_ITEM pRVar3;
  uint uVar4;
  undefined8 uVar5;
  REF_STATUS RVar6;
  ulong uVar7;
  char *pcVar8;
  long lVar9;
  REF_DBL uv_area;
  REF_DBL area;
  REF_DBL sign_uv_area;
  REF_INT nodes [27];
  double local_d0;
  REF_CELL local_c8;
  REF_GEOM local_c0;
  REF_DBL local_b8;
  double local_b0;
  REF_INT local_a8 [3];
  REF_INT local_9c;
  
  RVar6 = 0;
  if (-1 < node) {
    ref_cell = ref_grid->cell[3];
    pRVar1 = ref_cell->ref_adj;
    if ((node < pRVar1->nnode) && (lVar9 = (long)pRVar1->first[(uint)node], lVar9 != -1)) {
      ref_node = ref_grid->node;
      pRVar2 = ref_grid->geom;
      uVar4 = ref_cell_nodes(ref_cell,pRVar1->item[lVar9].ref,local_a8);
      if (uVar4 == 0) {
        local_c8 = ref_cell;
        local_c0 = pRVar2;
        do {
          uVar4 = ref_node_tri_area(ref_node,local_a8,&local_b8);
          if (uVar4 != 0) {
            uVar7 = (ulong)uVar4;
            pcVar8 = "vol";
            uVar5 = 0x49;
            goto LAB_001cff9c;
          }
          uVar4 = ref_geom_uv_area(local_c0,local_a8,&local_d0);
          if (uVar4 != 0) {
            uVar7 = (ulong)uVar4;
            pcVar8 = "uv area";
            uVar5 = 0x4a;
            goto LAB_001cff9c;
          }
          uVar4 = ref_geom_uv_area_sign(ref_grid,local_9c,&local_b0);
          if (uVar4 != 0) {
            uVar7 = (ulong)uVar4;
            pcVar8 = "sign";
            uVar5 = 0x4b;
            goto LAB_001cff9c;
          }
          local_d0 = local_b0 * local_d0;
          if (local_d0 < 1e-20) {
            printf("area %e uv area %e bool %d\n",local_b8,(ulong)(local_d0 < ref_node->min_uv_area)
                  );
            return 1;
          }
          pRVar3 = local_c8->ref_adj->item;
          lVar9 = (long)pRVar3[(int)lVar9].next;
          if (lVar9 == -1) {
            return 0;
          }
          uVar4 = ref_cell_nodes(local_c8,pRVar3[lVar9].ref,local_a8);
        } while (uVar4 == 0);
      }
      uVar7 = (ulong)uVar4;
      pcVar8 = "cell nodes";
      uVar5 = 0x48;
LAB_001cff9c:
      RVar6 = (REF_STATUS)uVar7;
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",
             uVar5,"ref_collapse_post_uv_area",uVar7,pcVar8);
    }
  }
  return RVar6;
}

Assistant:

REF_FCN REF_STATUS ref_collapse_post_uv_area(REF_GRID ref_grid, REF_INT node) {
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT item, cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL sign_uv_area, uv_area, area;
  each_ref_cell_having_node(ref_cell, node, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "cell nodes");
    RSS(ref_node_tri_area(ref_node, nodes, &area), "vol");
    RSS(ref_geom_uv_area(ref_geom, nodes, &uv_area), "uv area");
    RSS(ref_geom_uv_area_sign(ref_grid, nodes[3], &sign_uv_area), "sign");
    uv_area *= sign_uv_area;
    if (uv_area < 1.0e-20) {
      printf("area %e uv area %e bool %d\n", area, uv_area,
             uv_area < ref_node_min_uv_area(ref_node));
      return REF_FAILURE;
    }
  }
  return REF_SUCCESS;
}